

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_ecc_weierstrass_decompress(void)

{
  mp_int *in_RAX;
  WeierstrassCurve *wc;
  mp_int *xorig;
  WeierstrassPoint *pWVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  mp_int *X;
  mp_int *local_38;
  
  local_38 = in_RAX;
  wc = wcurve();
  xorig = mp_new(0x90);
  pWVar1 = ecc_weierstrass_point_new_from_x(wc,xorig,0);
  if (pWVar1 != (WeierstrassPoint *)0x0) {
    ecc_weierstrass_point_free(pWVar1);
  }
  sVar2 = (*looplimit)(2);
  if (sVar2 != 0) {
    uVar4 = 0;
    do {
      sVar2 = (*looplimit)(5);
      if (1 < sVar2) {
        sVar2 = 1;
        do {
          pWVar1 = wpoint(wc,sVar2);
          ecc_weierstrass_get_affine(pWVar1,&local_38,(mp_int **)0x0);
          mp_copy_into(xorig,local_38);
          mp_free(local_38);
          ecc_weierstrass_point_free(pWVar1);
          test_index = test_index + 1;
          last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
          (*log_to_file)(last_filename);
          pWVar1 = ecc_weierstrass_point_new_from_x(wc,xorig,(uint)uVar4);
          (*log_to_file)((char *)0x0);
          safefree(last_filename);
          ecc_weierstrass_point_free(pWVar1);
          sVar2 = sVar2 + 1;
          sVar3 = (*looplimit)(5);
        } while (sVar2 < sVar3);
      }
      uVar4 = uVar4 + 1;
      sVar2 = (*looplimit)(2);
    } while (uVar4 < sVar2);
  }
  mp_free(xorig);
  ecc_weierstrass_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_weierstrass_decompress(void)
{
    WeierstrassCurve *wc = wcurve();

    /* As in the mp_modsqrt test, prime the lazy initialisation of the
     * ModsqrtContext */
    mp_int *x = mp_new(144);
    WeierstrassPoint *a = ecc_weierstrass_point_new_from_x(wc, x, 0);
    if (a)                 /* don't care whether this one succeeded */
        ecc_weierstrass_point_free(a);

    for (size_t p = 0; p < looplimit(2); p++) {
        for (size_t i = 1; i < looplimit(5); i++) {
            WeierstrassPoint *A = wpoint(wc, i);
            mp_int *X;
            ecc_weierstrass_get_affine(A, &X, NULL);
            mp_copy_into(x, X);
            mp_free(X);
            ecc_weierstrass_point_free(A);

            log_start();
            WeierstrassPoint *a = ecc_weierstrass_point_new_from_x(wc, x, p);
            log_end();

            ecc_weierstrass_point_free(a);
        }
    }
    mp_free(x);
    ecc_weierstrass_curve_free(wc);
}